

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

string * __thiscall
t_xml_generator::escape_xml_string
          (string *__return_storage_ptr__,t_xml_generator *this,string *input)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  size_type sVar5;
  char *pcVar6;
  ostringstream ss;
  byte local_1a9;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  sVar2 = input->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (input->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      lVar4 = 6;
      if (bVar1 < 0x27) {
        pcVar6 = "&quot;";
        if (bVar1 == 0x22) goto LAB_003651b8;
        if (bVar1 == 0x26) {
          lVar4 = 5;
          pcVar6 = "&amp;";
          goto LAB_003651b8;
        }
LAB_003651ca:
        local_1a9 = bVar1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1a9,1);
      }
      else {
        if (bVar1 == 0x27) {
          pcVar6 = "&apos;";
        }
        else if (bVar1 == 0x3c) {
          lVar4 = 4;
          pcVar6 = "&lt;";
        }
        else {
          if (bVar1 != 0x3e) goto LAB_003651ca;
          lVar4 = 4;
          pcVar6 = "&gt;";
        }
LAB_003651b8:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar4);
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_xml_generator::escape_xml_string(const string& input) {
  std::ostringstream ss;
  for (char iter : input) {
    switch (iter) {
    case '&':
      ss << "&amp;";
      break;
    case '"':
      ss << "&quot;";
      break;
    case '\'':
      ss << "&apos;";
      break;
    case '<':
      ss << "&lt;";
      break;
    case '>':
      ss << "&gt;";
      break;
    default:
      ss << iter;
      break;
    }
  }
  return ss.str();
}